

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::ComputeDefines
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *headTarget;
  bool bVar2;
  uint uVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string *psVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string local_210;
  cmValue local_1f0;
  cmValue config_compile_defs;
  undefined1 local_1c8 [8];
  string defPropName;
  cmValue local_188;
  cmValue compile_defs;
  undefined1 local_178 [8];
  string COMPILE_DEFINITIONS;
  char local_141;
  string local_140;
  string local_120;
  string local_f0;
  undefined1 local_d0 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  string *config_local;
  string *language_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *definesString;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&genexInterpreter.Language.field_2 + 8));
  pcVar1 = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_f0,(string *)config);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string((string *)&local_120,(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_d0,(cmLocalGenerator *)pcVar1,&local_f0,
             headTarget,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_f0);
  pcVar4 = GetGlobalGenerator(this);
  uVar3 = (*(pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x28])();
  if ((uVar3 & 1) != 0) {
    local_141 = '\"';
    cmStrCat<char_const(&)[15],std::__cxx11::string_const&,char>
              (&local_140,(char (*) [15])"CMAKE_INTDIR=\"",config,&local_141);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&genexInterpreter.Language.field_2 + 8),&local_140);
    COMPILE_DEFINITIONS.field_2._8_8_ = pVar6.first._M_node;
    std::__cxx11::string::~string((string *)&local_140);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178,"COMPILE_DEFINITIONS",
             (allocator<char> *)((long)&compile_defs.Value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&compile_defs.Value + 7));
  local_188 = cmSourceFile::GetProperty(source,(string *)local_178);
  bVar2 = cmValue::operator_cast_to_bool(&local_188);
  if (bVar2) {
    pcVar1 = this->LocalGenerator;
    psVar5 = cmValue::operator*[abi_cxx11_(&local_188);
    std::__cxx11::string::string((string *)(defPropName.field_2._M_local_buf + 8),(string *)psVar5);
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_d0,
                        (string *)((long)&defPropName.field_2 + 8),(string *)local_178);
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&genexInterpreter.Language.field_2 + 8),psVar5);
    std::__cxx11::string::~string((string *)(defPropName.field_2._M_local_buf + 8));
  }
  cmsys::SystemTools::UpperCase((string *)&config_compile_defs,config);
  cmStrCat<char_const(&)[21],std::__cxx11::string>
            ((string *)local_1c8,(char (*) [21])"COMPILE_DEFINITIONS_",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &config_compile_defs);
  std::__cxx11::string::~string((string *)&config_compile_defs);
  local_1f0 = cmSourceFile::GetProperty(source,(string *)local_1c8);
  bVar2 = cmValue::operator_cast_to_bool(&local_1f0);
  if (bVar2) {
    pcVar1 = this->LocalGenerator;
    psVar5 = cmValue::operator*[abi_cxx11_(&local_1f0);
    std::__cxx11::string::string((string *)&local_210,(string *)psVar5);
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_d0,&local_210,(string *)local_178)
    ;
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&genexInterpreter.Language.field_2 + 8),psVar5);
    std::__cxx11::string::~string((string *)&local_210);
  }
  cmCommonTargetGenerator::GetDefines
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language,config);
  cmLocalGenerator::JoinDefines
            ((cmLocalGenerator *)this->LocalGenerator,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&genexInterpreter.Language.field_2 + 8),__return_storage_ptr__,language);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)local_178);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_d0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&genexInterpreter.Language.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeDefines(cmSourceFile const* source,
                                                   const std::string& language,
                                                   const std::string& config)
{
  std::set<std::string> defines;
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  // Seriously??
  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    defines.insert(cmStrCat("CMAKE_INTDIR=\"", config, '"'));
  }

  const std::string COMPILE_DEFINITIONS("COMPILE_DEFINITIONS");
  if (cmValue compile_defs = source->GetProperty(COMPILE_DEFINITIONS)) {
    this->LocalGenerator->AppendDefines(
      defines, genexInterpreter.Evaluate(*compile_defs, COMPILE_DEFINITIONS));
  }

  std::string defPropName =
    cmStrCat("COMPILE_DEFINITIONS_", cmSystemTools::UpperCase(config));
  if (cmValue config_compile_defs = source->GetProperty(defPropName)) {
    this->LocalGenerator->AppendDefines(
      defines,
      genexInterpreter.Evaluate(*config_compile_defs, COMPILE_DEFINITIONS));
  }

  std::string definesString = this->GetDefines(language, config);
  this->LocalGenerator->JoinDefines(defines, definesString, language);

  return definesString;
}